

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyInteger4Mask
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          bool enableRef0,GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,
          GLint reference3,bool enableRef3)

{
  GLenum pname;
  bool bVar1;
  qpTestResult qVar2;
  long (*palVar3) [4];
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228 [3];
  MessageBuilder local_210;
  undefined1 local_90 [8];
  StateQueryMemoryWriteGuard<long[4]> intVector4;
  GLint local_28;
  bool enableRef3_local;
  bool enableRef2_local;
  bool enableRef1_local;
  GLint reference1_local;
  GLenum GStack_1c;
  bool enableRef0_local;
  GLint reference0_local;
  GLenum name_local;
  TestContext *testCtx_local;
  GetInteger64Verifier *this_local;
  
  intVector4.m_postguard[3]._7_1_ = enableRef1;
  intVector4.m_postguard[3]._6_1_ = enableRef2;
  intVector4.m_postguard[3]._5_1_ = enableRef3;
  local_28 = reference1;
  enableRef1_local = enableRef0;
  reference1_local = reference0;
  GStack_1c = name;
  _reference0_local = testCtx;
  testCtx_local = (TestContext *)this;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<long[4]> *)local_90);
  pname = GStack_1c;
  palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_90);
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,pname,*palVar3);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                    ((StateQueryMemoryWriteGuard<long[4]> *)local_90,_reference0_local);
  if ((bVar1) &&
     ((((((enableRef1_local & 1U) != 0 &&
         (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_90),
         (*palVar3)[0] != (long)reference1_local)) ||
        (((intVector4.m_postguard[3]._7_1_ & 1) != 0 &&
         (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                    operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_90),
         (*palVar3)[1] != (long)local_28)))) ||
       (((intVector4.m_postguard[3]._6_1_ & 1) != 0 &&
        (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                   operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_90),
        (*palVar3)[2] != (long)reference2)))) ||
      (((intVector4.m_postguard[3]._5_1_ & 1) != 0 &&
       (palVar3 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_90),
       (*palVar3)[3] != (long)reference3)))))) {
    this_00 = tcu::TestContext::getLog(_reference0_local);
    tcu::TestLog::operator<<(&local_210,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [20])"// ERROR: expected ");
    local_228[0] = "(";
    if ((enableRef1_local & 1U) != 0) {
      local_228[0] = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_228);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference1_local);
    local_230 = ")";
    if ((enableRef1_local & 1U) != 0) {
      local_230 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_230);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    local_238 = "(";
    if ((intVector4.m_postguard[3]._7_1_ & 1) != 0) {
      local_238 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_238);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_28);
    local_240 = ")";
    if ((intVector4.m_postguard[3]._7_1_ & 1) != 0) {
      local_240 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_240);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    local_248 = "(";
    if ((intVector4.m_postguard[3]._6_1_ & 1) != 0) {
      local_248 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_248);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference2);
    local_250 = ")";
    if ((intVector4.m_postguard[3]._6_1_ & 1) != 0) {
      local_250 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_250);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x2a4b1eb);
    local_258 = "(";
    if ((intVector4.m_postguard[3]._5_1_ & 1) != 0) {
      local_258 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_258);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&reference3);
    local_260 = ")";
    if ((intVector4.m_postguard[3]._5_1_ & 1) != 0) {
      local_260 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_260);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    qVar2 = tcu::TestContext::getTestResult(_reference0_local);
    if (qVar2 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                (_reference0_local,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64[4]> intVector4;
	glGetInteger64v(name, intVector4);

	if (!intVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (intVector4[0] != GLint64(reference0))) ||
		(enableRef1 && (intVector4[1] != GLint64(reference1))) ||
		(enableRef2 && (intVector4[2] != GLint64(reference2))) ||
		(enableRef3 && (intVector4[3] != GLint64(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << reference0 << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << reference1 << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << reference2 << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << reference3 << (enableRef3?"":")")	<< TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}